

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O3

bool __thiscall Glucose::SimpSolver::substitute(SimpSolver *this,Var v,Lit x)

{
  unsigned_long *puVar1;
  vec<Glucose::Lit> *this_00;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  uint *puVar5;
  bool bVar6;
  int iVar7;
  vec<unsigned_int> *pvVar8;
  long lVar9;
  long lVar10;
  Var local_48;
  Lit local_44;
  vec<unsigned_int> *local_40;
  SimpSolver *local_38;
  
  if ((this->super_Solver).ok == true) {
    lVar10 = (long)v;
    (this->eliminated).data[lVar10] = '\x01';
    pcVar4 = (this->super_Solver).decision.data;
    if (pcVar4[lVar10] != '\0') {
      puVar1 = (this->super_Solver).stats.data + 0x12;
      *puVar1 = *puVar1 - 1;
    }
    pcVar4[lVar10] = '\0';
    local_48 = v;
    if ((((this->super_Solver).order_heap.indices.sz <= v) ||
        ((this->super_Solver).order_heap.indices.data[lVar10] < 0)) &&
       ((this->super_Solver).decision.data[lVar10] != '\0')) {
      Heap<Glucose::Solver::VarOrderLt>::insert(&(this->super_Solver).order_heap,v);
    }
    if ((this->occurs).dirty.data[lVar10] != '\0') {
      OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::clean
                (&this->occurs,&local_48);
      lVar10 = (long)local_48;
    }
    pvVar8 = (this->occurs).occs.data;
    bVar6 = true;
    if (0 < pvVar8[lVar10].sz) {
      pvVar8 = pvVar8 + lVar10;
      this_00 = &(this->super_Solver).add_tmp;
      lVar10 = 0;
      local_40 = pvVar8;
      local_38 = this;
      do {
        uVar2 = pvVar8->data[lVar10];
        if ((this->super_Solver).add_tmp.data != (Lit *)0x0) {
          (this->super_Solver).add_tmp.sz = 0;
        }
        puVar5 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
        if (0 < (int)puVar5[(ulong)uVar2 + 1]) {
          lVar9 = 0;
          do {
            uVar3 = puVar5[(ulong)uVar2 + lVar9 + 3];
            local_44.x = uVar3 & 1 ^ x.x;
            if ((int)uVar3 >> 1 != local_48) {
              local_44.x = uVar3;
            }
            vec<Glucose::Lit>::push(this_00,&local_44);
            lVar9 = lVar9 + 1;
          } while (lVar9 < (int)puVar5[(ulong)uVar2 + 1]);
        }
        this = local_38;
        iVar7 = (*(local_38->super_Solver).super_Clone._vptr_Clone[4])(local_38,this_00);
        pvVar8 = local_40;
        if ((char)iVar7 == '\0') {
          (this->super_Solver).ok = false;
          goto LAB_00113fcd;
        }
        removeClause(this,local_40->data[lVar10],false);
        lVar10 = lVar10 + 1;
      } while (lVar10 < pvVar8->sz);
      bVar6 = true;
    }
  }
  else {
LAB_00113fcd:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool SimpSolver::substitute(Var v, Lit x)
{
    assert(!frozen[v]);
    assert(!isEliminated(v));
    assert(value(v) == l_Undef);

    if (!ok) return false;

    eliminated[v] = true;
    setDecisionVar(v, false);
    const vec<CRef>& cls = occurs.lookup(v);
    
    vec<Lit>& subst_clause = add_tmp;
    for (int i = 0; i < cls.size(); i++){
        Clause& c = ca[cls[i]];

        subst_clause.clear();
        for (int j = 0; j < c.size(); j++){
            Lit p = c[j];
            subst_clause.push(var(p) == v ? x ^ sign(p) : p);
        }

 
        if (!addClause_(subst_clause))
            return ok = false;

       removeClause(cls[i]);
 
   }

    return true;
}